

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O0

int * __thiscall OpenMD::PairList::getPairList(PairList *this)

{
  bool bVar1;
  reference pvVar2;
  long in_RDI;
  iterator i;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  _Self local_18;
  _Self local_10 [2];
  
  if ((*(byte *)(in_RDI + 0x48) & 1) != 0) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x22b8cb);
    local_10[0]._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    while( true ) {
      local_18._M_node =
           (_Base_ptr)
           std::
           set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
           ::end(in_stack_ffffffffffffffb8);
      bVar1 = std::operator!=(local_10,&local_18);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)in_stack_ffffffffffffffc0);
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffffc0,(value_type_conflict1 *)in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffd0 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x30);
      std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)in_stack_ffffffffffffffc0);
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffffc0,(value_type_conflict1 *)in_stack_ffffffffffffffb8);
      std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)in_stack_ffffffffffffffc0);
    }
    *(undefined1 *)(in_RDI + 0x48) = 0;
  }
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffffd0);
  if (bVar1) {
    pvVar2 = (reference)0x0;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),0);
  }
  return pvVar2;
}

Assistant:

int* PairList::getPairList() {
    if (modified_) {
      pairList_.clear();

      for (std::set<std::pair<int, int>>::iterator i = pairSet_.begin();
           i != pairSet_.end(); ++i) {
        pairList_.push_back(i->first + 1);
        pairList_.push_back(i->second + 1);
      }
      modified_ = false;
    }

    return pairList_.empty() ? NULL : &(pairList_[0]);
  }